

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerializer.cpp
# Opt level: O2

void __thiscall SimpleSerializer::Serialize(SimpleSerializer *this,IObject *pObject)

{
  uint __line;
  iterator iVar1;
  char *__assertion;
  ObjectId ownerId;
  
  if (pObject == (IObject *)0x0) {
    __assertion = "pObject";
    __line = 0x50;
  }
  else {
    if (this->m_pCurrentObject == (IObject *)0x0) {
      this->m_pCurrentObject = pObject;
      ownerId.m_PerTypeId._0_4_ = 0xffffffff;
      ownerId.m_PerTypeId._4_4_ = 0xffffffff;
      ownerId.m_ConstructorId._0_4_ = 0xffffffff;
      ownerId.m_ConstructorId._4_4_ = 0xffffffff;
      (**(code **)(*(long *)pObject + 0x28))(pObject,&ownerId);
      iVar1 = std::
              _Rb_tree<ObjectId,_std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>,_std::_Select1st<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>,_std::less<ObjectId>,_std::allocator<std::pair<const_ObjectId,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ISerializedValue_*>_>_>_>_>_>
              ::find(&(this->m_map)._M_t,&ownerId);
      (this->m_CurrentSerialization)._M_node = iVar1._M_node;
      (**(code **)(*(long *)this->m_pCurrentObject + 0x40))(this->m_pCurrentObject,this);
      this->m_pCurrentObject = (IObject *)0x0;
      return;
    }
    __assertion = "0 == m_pCurrentObject";
    __line = 0x51;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/SimpleSerializer/SimpleSerializer.cpp"
                ,__line,"void SimpleSerializer::Serialize(IObject *)");
}

Assistant:

void SimpleSerializer::Serialize( IObject* pObject )
{
	assert( pObject );
	assert( 0 == m_pCurrentObject );	//should not serialize an object from within another

	m_pCurrentObject = pObject;
	ObjectId ownerId;
	m_pCurrentObject->GetObjectId(ownerId);

//	gSys->pLogSystem->Log( eLV_COMMENTS, "SimpleSerialiser: Serialising %s object: objectIdtype \"%s\", perTypeID:%d, address:0x%p\n"
//			, m_bLoading ? "in" : "out", pObject->GetTypeName(), ownerId.m_PerTypeId, pObject );

	m_CurrentSerialization = m_map.find(ownerId);

	m_pCurrentObject->Serialize( this );

	//reset m_pCurrentObject
	m_pCurrentObject = 0;
}